

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QShaderDescription::BlockVariable>::moveAppend
          (QGenericArrayOps<QShaderDescription::BlockVariable> *this,BlockVariable *b,
          BlockVariable *e)

{
  qsizetype *pqVar1;
  BlockVariable *pBVar2;
  long lVar3;
  Data *pDVar4;
  char *pcVar5;
  qsizetype qVar6;
  Data *pDVar7;
  int *piVar8;
  Data *pDVar9;
  BlockVariable *pBVar10;
  int iVar11;
  
  if ((b != e) && (b < e)) {
    pBVar2 = (this->super_QArrayDataPointer<QShaderDescription::BlockVariable>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QShaderDescription::BlockVariable>).size;
      pDVar4 = (b->name).d.d;
      (b->name).d.d = (Data *)0x0;
      pBVar2[lVar3].name.d.d = pDVar4;
      pcVar5 = (b->name).d.ptr;
      (b->name).d.ptr = (char *)0x0;
      pBVar2[lVar3].name.d.ptr = pcVar5;
      qVar6 = (b->name).d.size;
      (b->name).d.size = 0;
      pBVar2[lVar3].name.d.size = qVar6;
      iVar11 = b->offset;
      pBVar2[lVar3].type = b->type;
      pBVar2[lVar3].offset = iVar11;
      pBVar2[lVar3].size = b->size;
      pDVar7 = (b->arrayDims).d.d;
      (b->arrayDims).d.d = (Data *)0x0;
      pBVar2[lVar3].arrayDims.d.d = pDVar7;
      piVar8 = (b->arrayDims).d.ptr;
      (b->arrayDims).d.ptr = (int *)0x0;
      pBVar2[lVar3].arrayDims.d.ptr = piVar8;
      qVar6 = (b->arrayDims).d.size;
      (b->arrayDims).d.size = 0;
      pBVar2[lVar3].arrayDims.d.size = qVar6;
      iVar11 = b->matrixStride;
      pBVar2[lVar3].arrayStride = b->arrayStride;
      pBVar2[lVar3].matrixStride = iVar11;
      pBVar2[lVar3].matrixIsRowMajor = b->matrixIsRowMajor;
      pDVar9 = (b->structMembers).d.d;
      (b->structMembers).d.d = (Data *)0x0;
      pBVar2[lVar3].structMembers.d.d = pDVar9;
      pBVar10 = (b->structMembers).d.ptr;
      (b->structMembers).d.ptr = (BlockVariable *)0x0;
      pBVar2[lVar3].structMembers.d.ptr = pBVar10;
      qVar6 = (b->structMembers).d.size;
      (b->structMembers).d.size = 0;
      pBVar2[lVar3].structMembers.d.size = qVar6;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QShaderDescription::BlockVariable>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }